

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void libcellml::Variable::removeEquivalenceMappingId(VariablePtr *variable1,VariablePtr *variable2)

{
  Variable *this;
  VariableImpl *pVVar1;
  bool bVar2;
  allocator<char> local_39;
  string local_38;
  
  this = (variable1->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((this != (Variable *)0x0) &&
     ((variable2->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0)) {
    bVar2 = hasEquivalentVariable(this,variable2,true);
    if (bVar2) {
      pVVar1 = (VariableImpl *)
               (((variable1->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
      VariableImpl::setEquivalentMappingId(pVVar1,variable2,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      pVVar1 = (VariableImpl *)
               (((variable2->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
      VariableImpl::setEquivalentMappingId(pVVar1,variable1,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return;
}

Assistant:

void Variable::removeEquivalenceMappingId(const VariablePtr &variable1, const VariablePtr &variable2)
{
    if ((variable1 != nullptr) && (variable2 != nullptr)) {
        if (variable1->hasEquivalentVariable(variable2, true)) {
            variable1->pFunc()->setEquivalentMappingId(variable2, "");
            variable2->pFunc()->setEquivalentMappingId(variable1, "");
        }
    }
}